

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

void voc_parse_dict_lookup(voccxdef *ctx)

{
  objnum *list2;
  char cVar1;
  ushort uVar2;
  runcxdef *ctx_00;
  runsdef *prVar3;
  ushort *puVar4;
  ushort **ppuVar5;
  vocwdef *pvVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int len2;
  ushort *wrd2;
  objnum *list1;
  uint typsiz;
  uint wrdsiz;
  vocseadef search_ctx;
  int local_a8;
  uint local_a4;
  ulong local_a0;
  uint local_94;
  ushort *local_90;
  objnum *local_88;
  voccxdef *local_80;
  ulong local_78;
  ushort *local_70;
  ulong local_68;
  vocseadef local_60;
  
  list1 = (objnum *)ctx->voc_stk_cur;
  list2 = list1 + 200;
  if (list2 <= ctx->voc_stk_end) {
    ctx_00 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)list2;
    if (list1 + 400 <= ctx->voc_stk_end) {
      ctx->voc_stk_cur = (uchar *)(list1 + 400);
      prVar3 = ctx_00->runcxsp;
      ctx_00->runcxsp = prVar3 + -1;
      if (prVar3[-1].runstyp == '\a') {
        local_94 = *(ushort *)prVar3[-1].runsv.runsvstr - 2;
        local_90 = (ushort *)((long)prVar3[-1].runsv.runsvstr + 2);
        ctx_00->runcxsp = prVar3 + -2;
        if (prVar3[-2].runstyp == '\a') {
          local_a4 = *(ushort *)prVar3[-2].runsv.runsvstr - 2;
          local_70 = (ushort *)((long)prVar3[-2].runsv.runsvstr + 2);
          if (local_94 == 0) {
LAB_001f455f:
            local_a0 = 0;
          }
          else {
            local_a0 = 0;
            local_88 = list1;
            local_80 = ctx;
            do {
              puVar4 = local_90;
              if ((char)*local_90 == '\x03') {
                uVar2 = *(ushort *)((long)local_90 + 1);
                local_78 = 0;
                if (uVar2 - 2 == 0) {
                  local_a8 = 0;
                  wrd2 = (ushort *)0x0;
                  len2 = 0;
                }
                else {
                  wrd2 = local_90 + 2;
                  local_a8 = 0;
                  local_68 = (ulong)uVar2;
                  do {
                    cVar1 = *(char *)((long)wrd2 + -1);
                    if ((-1 < (long)cVar1) &&
                       (ppuVar5 = __ctype_b_loc(),
                       (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
                      len2 = ((int)local_68 - local_a8) + -3;
                      ctx = local_80;
                      list1 = local_88;
                      goto LAB_001f443e;
                    }
                    local_a8 = local_a8 + 1;
                    wrd2 = (ushort *)((long)wrd2 + 1);
                  } while (uVar2 - 2 != local_a8);
                  wrd2 = (ushort *)0x0;
                  len2 = 0;
                  ctx = local_80;
                  list1 = local_88;
                  local_a8 = uVar2 - 2;
                }
LAB_001f443e:
                if ((local_a4 != 0) && ((char)*local_70 == '\x01')) {
                  lVar7 = 0;
                  do {
                    if ((voc_parse_dict_lookup::typemap[lVar7].flag & *(uint *)((long)local_70 + 1))
                        != 0) {
                      local_78 = (ulong)(uint)voc_parse_dict_lookup::typemap[lVar7].prop;
                      break;
                    }
                    lVar7 = lVar7 + 1;
                  } while ((int)lVar7 != 6);
                }
                pvVar6 = vocffw(ctx,(char *)((long)puVar4 + 3),local_a8,(char *)wrd2,len2,
                                (int)local_78,&local_60);
                uVar9 = 0;
                if (pvVar6 != (vocwdef *)0x0) {
                  do {
                    uVar8 = 0;
                    if ((int)uVar9 < 1) {
LAB_001f44c7:
                      if ((uint)uVar8 == uVar9) goto LAB_001f44cb;
                    }
                    else {
                      uVar8 = 0;
                      do {
                        if (list2[uVar8] == pvVar6->vocwobj) goto LAB_001f44c7;
                        uVar8 = uVar8 + 1;
                      } while (uVar9 != uVar8);
LAB_001f44cb:
                      lVar7 = (long)(int)uVar9;
                      uVar9 = uVar9 + 1;
                      list2[lVar7] = pvVar6->vocwobj;
                    }
                    pvVar6 = vocfnw(ctx,&local_60);
                  } while ((pvVar6 != (vocwdef *)0x0) && ((int)uVar9 < 199));
                }
                list2[(int)uVar9] = 0xffff;
                if ((int)local_a0 == 0) {
                  memcpy(list1,list2,(long)(int)uVar9 * 2 + 2);
                }
                else {
                  uVar9 = vocisect(list1,list2);
                }
                local_a0 = (ulong)uVar9;
                if (uVar9 == 0) goto LAB_001f455f;
              }
              lstadv((uchar **)&local_90,&local_94);
              if (local_a4 != 0) {
                lstadv((uchar **)&local_70,&local_a4);
              }
            } while (local_94 != 0);
          }
          voc_push_objlist(ctx,list1,(int)local_a0);
          ctx->voc_stk_cur = (uchar *)list1;
          return;
        }
      }
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3fc);
    }
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

void voc_parse_dict_lookup(voccxdef *ctx)
{
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    uchar *wrdp;
    uint wrdsiz;
    uchar *typp;
    uint typsiz;
    objnum *list1;
    objnum *list2;
    int cnt1;
    int cnt2;

    /* enter our stack frame and allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, objnum, list1);
    VOC_MAX_ARRAY(ctx, objnum, list2);
    
    /* get the word list, and read and skip its size prefix */
    wrdp = runpoplst(rcx);
    wrdsiz = osrp2(wrdp) - 2;
    wrdp += 2;

    /* get the type list, and read and skip its size prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* nothing in the main list yet */
    cnt1 = 0;

    /* go through the word list */
    while (wrdsiz > 0)
    {
        int curtyp;
        int type_prop;
        char *curword;
        uint curwordlen;
        char *curword2;
        uint curwordlen2;
        vocwdef *v;
        char *p;
        uint len;
        vocseadef  search_ctx;
        
        /* if this entry is a string, consider it */
        if (*wrdp == DAT_SSTRING)
        {
            /* get the current word's text string */
            curword = (char *)(wrdp + 3);
            curwordlen = osrp2(wrdp+1) - 2;

            /* check for an embedded space */
            for (p = curword, len = curwordlen ; len != 0 && !t_isspace(*p) ;
                 ++p, --len) ;
            if (len != 0)
            {
                /* get the second word */
                curword2 = p + 1;
                curwordlen2 = len - 1;

                /* truncate the first word accordingly */
                curwordlen -= len;
            }
            else
            {
                /* no embedded space -> no second word */
                curword2 = 0;
                curwordlen2 = 0;
            }

            /* presume we won't find a valid type property */
            type_prop = PRP_INVALID;

            /* 
             *   get this type entry, if there's another entry in the
             *   list, and it's of the appropriate type 
             */
            if (typsiz > 0 && *typp == DAT_NUMBER)
            {
                /*
                 *   Figure out what type property we'll be using.  We'll
                 *   consider only one meaning for each word, and we'll
                 *   arbitrarily pick one if the type code has more than
                 *   one type, because we expect the caller to provide
                 *   exactly one type per word.  
                 */
                int i;
                struct typemap_t
                {
                    int flag;
                    int prop;
                };
                static struct typemap_t typemap[] =
                {
                    { VOCT_ARTICLE, PRP_ARTICLE },
                    { VOCT_ADJ,     PRP_ADJ },
                    { VOCT_NOUN,    PRP_NOUN },
                    { VOCT_PREP,    PRP_PREP },
                    { VOCT_VERB,    PRP_VERB },
                    { VOCT_PLURAL,  PRP_PLURAL }
                };
                struct typemap_t *mapp;

                /* get the type */
                curtyp = (int)osrp4(typp+1);

                /* search for a type */
                for (mapp = typemap, i = sizeof(typemap)/sizeof(typemap[0]) ;
                     i != 0 ; ++mapp, --i)
                {
                    /* if this flag is set, use this type property */
                    if ((curtyp & mapp->flag) != 0)
                    {
                        /* use this one */
                        type_prop = mapp->prop;
                        break;
                    }
                }
            }

            /* nothing in the new list yet */
            cnt2 = 0;

            /* scan for matching words */
            for (v = vocffw(ctx, curword, curwordlen, curword2, curwordlen2,
                            type_prop, &search_ctx) ;
                 v != 0 ;
                 v = vocfnw(ctx, &search_ctx))
            {
                int i;
                
                /* make sure we have room in our list */
                if (cnt2 >= VOCMAXAMBIG - 1)
                    break;

                /* make sure that this entry isn't already in our list */
                for (i = 0 ; i < cnt2 ; ++i)
                {
                    /* if this entry matches, stop looking */
                    if (list2[i] == v->vocwobj)
                        break;
                }

                /* if it's not already in the list, add it now */
                if (i == cnt2)
                {
                    /* add it to our list */
                    list2[cnt2++] = v->vocwobj;
                }
            }

            /* terminate the list */
            list2[cnt2] = MCMONINV;

            /* 
             *   if there's nothing in the first list, simply copy this
             *   into the first list; otherwise, intersect the two lists 
             */
            if (cnt1 == 0)
            {
                /* this is the first list -> copy it into the main list */
                memcpy(list1, list2, (cnt2+1)*sizeof(list2[0]));
                cnt1 = cnt2;
            }
            else
            {
                /* intersect the two lists */
                cnt1 = vocisect(list1, list2);
            }

            /* 
             *   if there's nothing in the result list now, there's no
             *   need to look any further, because further intersection
             *   will yield nothing 
             */
            if (cnt1 == 0)
                break;
        }
        
        /* advance the word list */
        lstadv(&wrdp, &wrdsiz);

        /* if there's anything left in the type list, advance it as well */
        if (typsiz > 0)
            lstadv(&typp, &typsiz);
    }

    /* push the result list */
    voc_push_objlist(ctx, list1, cnt1);

    /* exit our stack frame */
    voc_leave(ctx, save_sp);
}